

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFile(DescriptorPool *this,FileDescriptorProto *proto)

{
  LogMessage *pLVar1;
  Tables *pTVar2;
  FileDescriptor *pFVar3;
  scoped_ptr<google::protobuf::DescriptorPool::Tables> *this_00;
  DescriptorBuilder local_1b8;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  FileDescriptorProto *local_18;
  FileDescriptorProto *proto_local;
  DescriptorPool *this_local;
  
  local_51 = 0;
  local_18 = proto;
  proto_local = (FileDescriptorProto *)this;
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xd3d);
    local_51 = 1;
    pLVar1 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: fallback_database_ == NULL: ");
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,
                        "Cannot call BuildFile on a DescriptorPool that uses a DescriptorDatabase.  You must instead find a way to get your file into the underlying database."
                       );
    internal::LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (this->mutex_ != (Mutex *)0x0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xd41);
    local_a1 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: mutex_ == NULL: ");
    internal::LogFinisher::operator=(&local_a2,pLVar1);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  this_00 = &this->tables_;
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(pTVar2->known_bad_symbols_).
           super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(this_00);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(pTVar2->known_bad_files_).
           super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::get(this_00);
  DescriptorBuilder::DescriptorBuilder(&local_1b8,this,pTVar2,(ErrorCollector *)0x0);
  pFVar3 = DescriptorBuilder::BuildFile(&local_1b8,local_18);
  DescriptorBuilder::~DescriptorBuilder(&local_1b8);
  return pFVar3;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFile(
    const FileDescriptorProto& proto) {
  GOOGLE_CHECK(fallback_database_ == NULL)
    << "Cannot call BuildFile on a DescriptorPool that uses a "
       "DescriptorDatabase.  You must instead find a way to get your file "
       "into the underlying database.";
  GOOGLE_CHECK(mutex_ == NULL);   // Implied by the above GOOGLE_CHECK.
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  return DescriptorBuilder(this, tables_.get(), NULL).BuildFile(proto);
}